

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O1

void const_array_suite::expand_front(void)

{
  ulong uVar1;
  basic_iterator<const_int> first_end;
  basic_iterator<const_int> first_end_00;
  ulong uVar2;
  ulong uVar3;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  basic_iterator<const_int> first_begin;
  basic_iterator<const_int> first_begin_00;
  vector<int,_std::allocator<int>_> expect;
  circular_view<const_int,_18446744073709551615UL> span;
  int array [4];
  allocator_type local_a1;
  vector<int,_std::allocator<int>_> local_a0;
  circular_view<const_int,_18446744073709551615UL> local_88;
  int local_64 [3];
  circular_view<const_int,_18446744073709551615UL> *local_58;
  size_type sStack_50;
  view_pointer local_48;
  size_type sStack_40;
  type local_38 [4];
  
  local_88.member.data = local_38;
  local_38[0] = 0xb;
  local_38[1] = 0x16;
  local_38[2] = 0x21;
  local_38[3] = 0;
  local_88.member.cap = 3;
  local_88.member.size = 3;
  local_88.member.next = 3;
  local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x3;
  local_64[0] = 3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.capacity()","3",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x7d7,"void const_array_suite::expand_front()",&local_a0,local_64);
  local_64[0] = 0xb;
  local_64[1] = 0x16;
  local_64[2] = 0x21;
  __l._M_len = 3;
  __l._M_array = local_64;
  std::vector<int,_std::allocator<int>_>::vector(&local_a0,__l,&local_a1);
  uVar1 = local_88.member.cap * 2;
  uVar2 = uVar1 - (local_88.member.cap & 0x5555555555555555);
  uVar2 = (uVar2 >> 2 & 0x3333333333333333) + (uVar2 & 0x3333333333333333);
  uVar2 = ((uVar2 >> 4) + uVar2 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar2 >> 0x38 < 2) {
    uVar3 = uVar1 - 1 & local_88.member.next - local_88.member.size;
  }
  else {
    uVar3 = (local_88.member.next - local_88.member.size) % uVar1;
  }
  if ((byte)(uVar2 >> 0x38) < 2) {
    sStack_40 = uVar1 - 1 & local_88.member.next;
  }
  else {
    sStack_40 = local_88.member.next % uVar1;
  }
  local_48 = &local_88;
  first_end.current = sStack_40;
  first_end.parent = local_48;
  first_begin.current = uVar3;
  first_begin.parent = local_48;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int_const,18446744073709551615ul>::basic_iterator<int_const>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x7db,"void const_array_suite::expand_front()",first_begin,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  vista::circular_view<const_int,_18446744073709551615UL>::expand_front(&local_88,1);
  local_64[0] = 0x21;
  local_64[1] = 0xb;
  local_64[2] = 0x16;
  __l_00._M_len = 3;
  __l_00._M_array = local_64;
  std::vector<int,_std::allocator<int>_>::vector(&local_a0,__l_00,&local_a1);
  uVar1 = local_88.member.cap * 2;
  uVar2 = uVar1 - (local_88.member.cap & 0x5555555555555555);
  uVar2 = (uVar2 >> 2 & 0x3333333333333333) + (uVar2 & 0x3333333333333333);
  uVar2 = ((uVar2 >> 4) + uVar2 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar2 >> 0x38 < 2) {
    uVar3 = uVar1 - 1 & local_88.member.next - local_88.member.size;
  }
  else {
    uVar3 = (local_88.member.next - local_88.member.size) % uVar1;
  }
  if ((byte)(uVar2 >> 0x38) < 2) {
    sStack_50 = uVar1 - 1 & local_88.member.next;
  }
  else {
    sStack_50 = local_88.member.next % uVar1;
  }
  first_end_00.current = sStack_50;
  first_end_00.parent = &local_88;
  first_begin_00.current = uVar3;
  first_begin_00.parent = &local_88;
  local_58 = &local_88;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int_const,18446744073709551615ul>::basic_iterator<int_const>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x7e1,"void const_array_suite::expand_front()",first_begin_00,first_end_00,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void expand_front()
{
    int array[4] = { 11, 22, 33 };
    circular_view<const int> span(&array[0], &array[3],
                                   &array[0], 3);
    BOOST_TEST_EQ(span.capacity(), 3);
    {
        std::vector<int> expect = { 11, 22, 33 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.expand_front();
    {
        std::vector<int> expect = { 33, 11, 22 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
}